

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_demo2.c
# Opt level: O2

int main(int argc,char **argv)

{
  point_t *point;
  point_t *point_00;
  
  point = point_allocate();
  point_00 = point_allocate();
  point_new(point);
  point_init(point,3.0,0.0);
  point_new(point_00);
  point_init(point_00,0.0,4.0);
  printf("p1 = ");
  point_print(point,_stdout);
  printf(" p2 = ");
  point_print(point_00,_stdout);
  point_distance(point,point_00);
  printf(" distance = %lf\n");
  return 0;
}

Assistant:

int main(int argc, char*argv[])
{
    point_t* p1 = point_allocate();
    point_t* p2 = point_allocate();

    point_new(p1);
    point_init(p1, 3.0, 0);
    point_new(p2);
    point_init(p2, 0, 4.0);

    printf("p1 = ");
    point_print(p1, stdout);
    printf(" p2 = ");
    point_print(p2, stdout);
    printf(" distance = %lf\n", point_distance(p1, p2));
}